

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

iterator * __thiscall
QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::
emplace_helper<QOpenGL2GradientCache::CacheInfo>
          (QMultiHash<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *this,
          unsigned_long_long *key,CacheInfo *args)

{
  long lVar1;
  piter it;
  CacheInfo *in_RCX;
  Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *in_RDX;
  iterator *in_RSI;
  iterator *in_RDI;
  long in_FS_OFFSET;
  InsertionResult result;
  iterator *n;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n = in_RSI;
  QHashPrivate::Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
  ::findOrInsert<unsigned_long_long>(in_RDX,(unsigned_long_long *)in_RCX);
  QHashPrivate::
  iterator<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>::node
            ((iterator<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_>
              *)in_RCX);
  QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>::
  createInPlace<QOpenGL2GradientCache::CacheInfo>
            ((MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo> *)n,
             (unsigned_long_long *)in_RDX,in_RCX);
  (in_RSI->i).bucket = (in_RSI->i).bucket + 1;
  it.bucket = (size_t)in_RDX;
  it.d = (Data<QHashPrivate::MultiNode<unsigned_long_long,_QOpenGL2GradientCache::CacheInfo>_> *)
         in_RCX;
  iterator::iterator(in_RSI,it,(Chain **)in_RDI);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

iterator emplace_helper(Key &&key, Args &&...args)
    {
        auto result = d->findOrInsert(key);
        if (!result.initialized)
            Node::createInPlace(result.it.node(), std::move(key), std::forward<Args>(args)...);
        else
            result.it.node()->insertMulti(std::forward<Args>(args)...);
        ++m_size;
        return iterator(result.it);
    }